

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescendentFontWriter.cpp
# Opt level: O0

void __thiscall
DescendentFontWriter::WriteWidths
          (DescendentFontWriter *this,UIntAndGlyphEncodingInfoVector *inEncodedGlyphs,
          DictionaryContext *inFontContext)

{
  FreeTypeFaceWrapper *pFVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  size_t *psVar5;
  __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  local_80;
  __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  local_78 [3];
  unsigned_short local_5c;
  unsigned_short local_5a;
  unsigned_short previousCIDInList;
  size_t sStack_58;
  unsigned_short firstCIDInList;
  FT_Pos currentWidth;
  undefined1 local_48 [7];
  bool allWidthsSame;
  FTPosList widthsList;
  FT_Pos defaultWidth;
  const_iterator it;
  DictionaryContext *inFontContext_local;
  UIntAndGlyphEncodingInfoVector *inEncodedGlyphs_local;
  DescendentFontWriter *this_local;
  
  it._M_current = (pair<unsigned_int,_GlyphEncodingInfo> *)inFontContext;
  defaultWidth = (FT_Pos)std::
                         vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                         ::begin(inEncodedGlyphs);
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)local_48);
  currentWidth._7_1_ = 1;
  local_5a = 0;
  local_5c = 0;
  DictionaryContext::WriteKey((DictionaryContext *)it._M_current,&scDW_abi_cxx11_);
  pFVar1 = this->mFontInfo;
  ppVar3 = __gnu_cxx::
           __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
           ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                         *)&defaultWidth);
  widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size =
       FreeTypeFaceWrapper::GetGlyphWidth(pFVar1,ppVar3->first);
  DictionaryContext::WriteIntegerValue
            ((DictionaryContext *)it._M_current,
             widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size);
  __gnu_cxx::
  __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  ::operator++((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                *)&defaultWidth);
  do {
    local_78[0]._M_current =
         (pair<unsigned_int,_GlyphEncodingInfo> *)
         std::
         vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
         ::end(inEncodedGlyphs);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                        *)&defaultWidth,local_78);
    if (!bVar2) {
LAB_002b9add:
      sVar4 = std::__cxx11::list<long,_std::allocator<long>_>::size
                        ((list<long,_std::allocator<long>_> *)local_48);
      if (sVar4 != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
        ::operator++((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                      *)&defaultWidth);
        DictionaryContext::WriteKey((DictionaryContext *)it._M_current,&scW_abi_cxx11_);
        ObjectsContext::StartArray(this->mObjectsContext);
        while( true ) {
          local_80._M_current =
               (pair<unsigned_int,_GlyphEncodingInfo> *)
               std::
               vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
               ::end(inEncodedGlyphs);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                              *)&defaultWidth,&local_80);
          if (!bVar2) break;
          pFVar1 = this->mFontInfo;
          ppVar3 = __gnu_cxx::
                   __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                   ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                                 *)&defaultWidth);
          sStack_58 = FreeTypeFaceWrapper::GetGlyphWidth(pFVar1,ppVar3->first);
          if (sStack_58 !=
              widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size) {
            ppVar3 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                     ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                                   *)&defaultWidth);
            if ((uint)(ppVar3->second).mEncodedCharacter == local_5c + 1) {
              local_5c = local_5c + 1;
              psVar5 = (size_t *)
                       std::__cxx11::list<long,_std::allocator<long>_>::front
                                 ((list<long,_std::allocator<long>_> *)local_48);
              currentWidth._7_1_ = currentWidth._7_1_ & *psVar5 == sStack_58;
              std::__cxx11::list<long,_std::allocator<long>_>::push_back
                        ((list<long,_std::allocator<long>_> *)local_48,
                         (value_type_conflict6 *)&stack0xffffffffffffffa8);
            }
            else {
              WriteWidthsItem(this,(bool)(currentWidth._7_1_ & 1),(FTPosList *)local_48,local_5a,
                              local_5c);
              std::__cxx11::list<long,_std::allocator<long>_>::clear
                        ((list<long,_std::allocator<long>_> *)local_48);
              std::__cxx11::list<long,_std::allocator<long>_>::push_back
                        ((list<long,_std::allocator<long>_> *)local_48,
                         (value_type_conflict6 *)&stack0xffffffffffffffa8);
              currentWidth._7_1_ = 1;
              ppVar3 = __gnu_cxx::
                       __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                       ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                                     *)&defaultWidth);
              local_5a = (ppVar3->second).mEncodedCharacter;
              ppVar3 = __gnu_cxx::
                       __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                       ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                                     *)&defaultWidth);
              local_5c = (ppVar3->second).mEncodedCharacter;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
          ::operator++((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                        *)&defaultWidth);
        }
        sVar4 = std::__cxx11::list<long,_std::allocator<long>_>::size
                          ((list<long,_std::allocator<long>_> *)local_48);
        if (sVar4 != 0) {
          WriteWidthsItem(this,(bool)(currentWidth._7_1_ & 1),(FTPosList *)local_48,local_5a,
                          local_5c);
        }
        ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
      }
      std::__cxx11::list<long,_std::allocator<long>_>::~list
                ((list<long,_std::allocator<long>_> *)local_48);
      return;
    }
    pFVar1 = this->mFontInfo;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
             ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                           *)&defaultWidth);
    sStack_58 = FreeTypeFaceWrapper::GetGlyphWidth(pFVar1,ppVar3->first);
    if (sStack_58 !=
        widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size) {
      std::__cxx11::list<long,_std::allocator<long>_>::push_back
                ((list<long,_std::allocator<long>_> *)local_48,
                 (value_type_conflict6 *)&stack0xffffffffffffffa8);
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                             *)&defaultWidth);
      local_5a = (ppVar3->second).mEncodedCharacter;
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                             *)&defaultWidth);
      local_5c = (ppVar3->second).mEncodedCharacter;
      goto LAB_002b9add;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                  *)&defaultWidth);
  } while( true );
}

Assistant:

void DescendentFontWriter::WriteWidths(const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs,
										  DictionaryContext* inFontContext)
{
	UIntAndGlyphEncodingInfoVector::const_iterator it = inEncodedGlyphs.begin(); // will be the 0 glyph
	FT_Pos defaultWidth;
	FTPosList widthsList;
	bool allWidthsSame = true;
	FT_Pos currentWidth;
	unsigned short firstCIDInList = 0;
	unsigned short previousCIDInList = 0;

	// DW
	inFontContext->WriteKey(scDW);
	defaultWidth = mFontInfo->GetGlyphWidth(it->first);
	inFontContext->WriteIntegerValue(defaultWidth);

	++it;

	// find the first which is not default width
	for(; it != inEncodedGlyphs.end();++it)
	{
		currentWidth =  mFontInfo->GetGlyphWidth(it->first);
		if(currentWidth != defaultWidth)
		{
			widthsList.push_back(currentWidth);
			firstCIDInList = it->second.mEncodedCharacter;
			previousCIDInList = it->second.mEncodedCharacter;
			break;
		}
	}

	if(widthsList.size() != 0)
	{
		++it; // promote the iterator, from the already recorded glyph

		// W
		inFontContext->WriteKey(scW);
		mObjectsContext->StartArray();

		for(; it != inEncodedGlyphs.end();++it)
		{
			currentWidth = mFontInfo->GetGlyphWidth(it->first);
            if(currentWidth != defaultWidth)
			{
				if(it->second.mEncodedCharacter == previousCIDInList + 1)
				{
					++previousCIDInList;
					allWidthsSame &= (widthsList.front() == currentWidth);
					widthsList.push_back(currentWidth);
				}
				else
				{
					WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
					widthsList.clear();
					widthsList.push_back(currentWidth);
					allWidthsSame = true;
					firstCIDInList = it->second.mEncodedCharacter;
					previousCIDInList = it->second.mEncodedCharacter;
				}

			}
			
		}
		if(widthsList.size() > 0)
			WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
	}
}